

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::DataBuilderCollationIterator::nextCodePoint
          (DataBuilderCollationIterator *this,UErrorCode *param_1)

{
  short sVar1;
  UnicodeString *this_00;
  int32_t iVar2;
  uint uVar3;
  
  this_00 = this->s;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (this->pos == iVar2) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = UnicodeString::char32At(this_00,this->pos);
    this->pos = (this->pos - (uint)(uVar3 < 0x10000)) + 2;
  }
  return uVar3;
}

Assistant:

UChar32
DataBuilderCollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == s->length()) {
        return U_SENTINEL;
    }
    UChar32 c = s->char32At(pos);
    pos += U16_LENGTH(c);
    return c;
}